

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O0

bool sptk::WriteStream<signed_char>
               (int write_point,int write_size,
               vector<signed_char,_std::allocator<signed_char>_> *sequence_to_write,
               ostream *output_stream,int *actual_write_size)

{
  byte bVar1;
  size_type sVar2;
  const_reference pvVar3;
  streamoff sVar4;
  char *in_RCX;
  vector<signed_char,_std::allocator<signed_char>_> *in_RDX;
  int in_ESI;
  int in_EDI;
  int *in_R8;
  int type_byte;
  int after;
  int before;
  int end;
  int local_60;
  undefined1 local_58 [16];
  int local_44;
  undefined1 local_40 [16];
  int local_30;
  int local_2c;
  int *local_28;
  char *local_20;
  vector<signed_char,_std::allocator<signed_char>_> *local_18;
  int local_8;
  bool local_1;
  
  if (((in_EDI < 0) || (in_ESI < 1)) || (in_RCX == (char *)0x0)) {
    local_1 = false;
  }
  else {
    local_2c = in_EDI + in_ESI;
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_8 = in_EDI;
    sVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::size(in_RDX);
    if (sVar2 < (ulong)(long)local_2c) {
      local_1 = false;
    }
    else {
      if (local_28 == (int *)0x0) {
        local_60 = 0;
      }
      else {
        local_40 = std::ostream::tellp();
        sVar4 = std::fpos::operator_cast_to_long((fpos *)local_40);
        local_60 = (int)sVar4;
      }
      local_30 = local_60;
      pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[](local_18,0);
      std::ostream::write(local_20,(long)(pvVar3 + local_8));
      if (local_28 != (int *)0x0) {
        local_58 = std::ostream::tellp();
        sVar4 = std::fpos::operator_cast_to_long((fpos *)local_58);
        local_44 = (int)sVar4;
        *local_28 = (local_44 - local_30) / 1;
      }
      bVar1 = std::ios::fail();
      local_1 = (bool)((bVar1 ^ 0xff) & 1);
    }
  }
  return local_1;
}

Assistant:

bool WriteStream(int write_point, int write_size,
                 const std::vector<T>& sequence_to_write,
                 std::ostream* output_stream, int* actual_write_size) {
  if (write_point < 0 || write_size <= 0 || NULL == output_stream) {
    return false;
  }

  const int end(write_point + write_size);
  if (sequence_to_write.size() < static_cast<std::size_t>(end)) {
    return false;
  }

  const int before((NULL == actual_write_size)
                       ? 0
                       : static_cast<int>(output_stream->tellp()));

  output_stream->write(
      reinterpret_cast<const char*>(&(sequence_to_write[0]) + write_point),
      sizeof(sequence_to_write[0]) * write_size);

  // When output_stream is cout, actual_write_size is always zero.
  if (NULL != actual_write_size) {
    const int after(static_cast<int>(output_stream->tellp()));
    const int type_byte(sizeof(sequence_to_write[0]));
    *actual_write_size = (after - before) / type_byte;
  }

  return !output_stream->fail();
}